

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test
::TestBody(MessageDifferencerTest_RepeatedFieldSmartSet_MultipleMatches_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestField> *pRVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>_> *pVVar3;
  pointer *__ptr;
  char *message;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_548;
  AssertHelper local_540;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string diff_report;
  TestField local_4e8;
  TestField local_490;
  TestField local_438;
  TestField local_3e0;
  TestField local_388;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  proto2_unittest::TestField::TestField(&local_388);
  proto2_unittest::TestField::TestField(&local_3e0);
  proto2_unittest::TestField::TestField(&local_438);
  proto2_unittest::TestField::TestField(&local_490);
  proto2_unittest::TestField::TestField(&local_4e8);
  local_388.field_0._impl_.b_ = 1;
  local_388.field_0._56_8_ = &DAT_100000001;
  local_388.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_388.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_3e0.field_0._impl_.b_ = 2;
  local_490.field_0._impl_.b_ = 0;
  local_3e0.field_0._56_8_ = 0x200000002;
  local_3e0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_3e0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_490.field_0._56_8_ = 0x200000002;
  local_490.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_490.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_438.field_0._60_8_ = 0x300000003;
  local_4e8.field_0._impl_.c_ = 3;
  local_438.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_438.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  local_4e8.field_0._60_8_ = 3;
  local_4e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_4e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 0xe;
  pRVar1 = &msg1.field_0._impl_.rm_;
  local_438.field_0._impl_.c_ = local_4e8.field_0._impl_.c_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  proto2_unittest::TestField::CopyFrom(pVVar3,&local_388);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  proto2_unittest::TestField::CopyFrom(pVVar3,&local_3e0);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  proto2_unittest::TestField::CopyFrom(pVVar3,&local_438);
  pRVar1 = &msg2.field_0._impl_.rm_;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  proto2_unittest::TestField::CopyFrom(pVVar3,&local_490);
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestField>>
                     (&pRVar1->super_RepeatedPtrFieldBase);
  proto2_unittest::TestField::CopyFrom(pVVar3,&local_4e8);
  diff_report._M_dataplus._M_p = (pointer)&diff_report.field_2;
  diff_report._M_string_length = 0;
  diff_report.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::MessageDifferencer(&differencer);
  util::MessageDifferencer::ReportDifferencesToString(&differencer,&diff_report);
  util::MessageDifferencer::set_repeated_field_comparison(&differencer,AS_SMART_SET);
  bVar2 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar2;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_548);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6ce,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_540,(Message *)&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_548._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_548._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperEQ<char[110],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"modified: rm[1].b -> rm[0].b: 2 -> 0\\n\" \"modified: rm[2].b -> rm[1].b: 3 -> 0\\n\" \"deleted: rm[0]: { c: 1 a: 1 b: 1 }\\n\""
             ,"diff_report",
             (char (*) [110])
             "modified: rm[1].b -> rm[0].b: 2 -> 0\nmodified: rm[2].b -> rm[1].b: 3 -> 0\ndeleted: rm[0]: { c: 1 a: 1 b: 1 }\n"
             ,&diff_report);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x6d3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  std::__cxx11::string::~string((string *)&diff_report);
  proto2_unittest::TestField::~TestField(&local_4e8);
  proto2_unittest::TestField::~TestField(&local_490);
  proto2_unittest::TestField::~TestField(&local_438);
  proto2_unittest::TestField::~TestField(&local_3e0);
  proto2_unittest::TestField::~TestField(&local_388);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSet_MultipleMatches) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem1_1, elem2_1, elem3_1;
  proto2_unittest::TestField elem2_2, elem3_2;

  // Only one field is different for each pair of elements
  elem1_1.set_a(1);
  elem1_1.set_b(1);
  elem1_1.set_c(1);
  elem2_1.set_a(2);
  elem2_2.set_a(2);
  elem2_1.set_b(2);
  elem2_2.set_b(0);
  elem2_1.set_c(2);
  elem2_2.set_c(2);
  elem3_1.set_a(3);
  elem3_2.set_a(3);
  elem3_1.set_b(3);
  elem3_2.set_b(0);
  elem3_1.set_c(3);
  elem3_2.set_c(3);

  // In this testcase, elem1_1 will match with elem2_2 first and then get
  // reverted because elem2_1 matches with elem2_2 later.
  *msg1.add_rm() = elem1_1;
  *msg1.add_rm() = elem2_1;
  *msg1.add_rm() = elem3_1;
  *msg2.add_rm() = elem2_2;
  *msg2.add_rm() = elem3_2;

  std::string diff_report;
  util::MessageDifferencer differencer;
  differencer.ReportDifferencesToString(&diff_report);
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: rm[1].b -> rm[0].b: 2 -> 0\n"
      "modified: rm[2].b -> rm[1].b: 3 -> 0\n"
      "deleted: rm[0]: { c: 1 a: 1 b: 1 }\n",
      diff_report);
}